

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EverCrypt_Hash.c
# Opt level: O0

uint32_t EverCrypt_Hash_Incremental_hash_len(Spec_Hash_Definitions_hash_alg a)

{
  uint32_t local_c;
  Spec_Hash_Definitions_hash_alg a_local;
  
  switch(a) {
  case '\0':
    local_c = 0x1c;
    break;
  case '\x01':
    local_c = 0x20;
    break;
  case '\x02':
    local_c = 0x30;
    break;
  case '\x03':
    local_c = 0x40;
    break;
  case '\x04':
    local_c = 0x14;
    break;
  case '\x05':
    local_c = 0x10;
    break;
  case '\x06':
    local_c = 0x20;
    break;
  case '\a':
    local_c = 0x40;
    break;
  case '\b':
    local_c = 0x20;
    break;
  case '\t':
    local_c = 0x1c;
    break;
  case '\n':
    local_c = 0x30;
    break;
  case '\v':
    local_c = 0x40;
    break;
  default:
    fprintf(_stderr,"KaRaMeL incomplete match at %s:%d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/EverCrypt_Hash.c"
            ,0x4c6);
    exit(0xfd);
  }
  return local_c;
}

Assistant:

uint32_t EverCrypt_Hash_Incremental_hash_len(Spec_Hash_Definitions_hash_alg a)
{
  switch (a)
  {
    case Spec_Hash_Definitions_MD5:
      {
        return MD5_HASH_LEN;
      }
    case Spec_Hash_Definitions_SHA1:
      {
        return SHA1_HASH_LEN;
      }
    case Spec_Hash_Definitions_SHA2_224:
      {
        return SHA2_224_HASH_LEN;
      }
    case Spec_Hash_Definitions_SHA2_256:
      {
        return SHA2_256_HASH_LEN;
      }
    case Spec_Hash_Definitions_SHA2_384:
      {
        return SHA2_384_HASH_LEN;
      }
    case Spec_Hash_Definitions_SHA2_512:
      {
        return SHA2_512_HASH_LEN;
      }
    case Spec_Hash_Definitions_SHA3_224:
      {
        return SHA3_224_HASH_LEN;
      }
    case Spec_Hash_Definitions_SHA3_256:
      {
        return SHA3_256_HASH_LEN;
      }
    case Spec_Hash_Definitions_SHA3_384:
      {
        return SHA3_384_HASH_LEN;
      }
    case Spec_Hash_Definitions_SHA3_512:
      {
        return SHA3_512_HASH_LEN;
      }
    case Spec_Hash_Definitions_Blake2S:
      {
        return BLAKE2S_HASH_LEN;
      }
    case Spec_Hash_Definitions_Blake2B:
      {
        return BLAKE2B_HASH_LEN;
      }
    default:
      {
        KRML_HOST_EPRINTF("KaRaMeL incomplete match at %s:%d\n", __FILE__, __LINE__);
        KRML_HOST_EXIT(253U);
      }
  }
}